

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_odc.c
# Opt level: O0

int archive_write_odc_header(archive_write *a,archive_entry *entry)

{
  mode_t mVar1;
  wchar_t wVar2;
  int iVar3;
  char *pcVar4;
  archive_string_conv *sc;
  int *piVar5;
  la_int64_t lVar6;
  size_t local_30;
  size_t len;
  char *path;
  archive_entry *entry_local;
  archive_write *a_local;
  
  path = (char *)entry;
  entry_local = (archive_entry *)a;
  mVar1 = archive_entry_filetype(entry);
  if ((mVar1 == 0) &&
     (pcVar4 = archive_entry_hardlink((archive_entry *)path), pcVar4 == (char *)0x0)) {
    archive_set_error((archive *)entry_local,-1,"Filetype required");
    return -0x19;
  }
  pcVar4 = path;
  sc = get_sconv((archive_write *)entry_local);
  wVar2 = _archive_entry_pathname_l((archive_entry *)pcVar4,(char **)&len,&local_30,sc);
  if ((wVar2 != L'\0') && (piVar5 = __errno_location(), *piVar5 == 0xc)) {
    archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Pathname");
    return -0x1e;
  }
  if (((local_30 == 0) || (len == 0)) || (*(char *)len == '\0')) {
    archive_set_error((archive *)entry_local,-1,"Pathname required");
  }
  else {
    wVar2 = archive_entry_size_is_set((archive_entry *)path);
    if ((wVar2 != L'\0') && (lVar6 = archive_entry_size((archive_entry *)path), -1 < lVar6)) {
      iVar3 = write_header((archive_write *)entry_local,(archive_entry *)path);
      return iVar3;
    }
    archive_set_error((archive *)entry_local,-1,"Size required");
  }
  return -0x19;
}

Assistant:

static int
archive_write_odc_header(struct archive_write *a, struct archive_entry *entry)
{
	const char *path;
	size_t len;

	if (archive_entry_filetype(entry) == 0 && archive_entry_hardlink(entry) == NULL) {
		archive_set_error(&a->archive, -1, "Filetype required");
		return (ARCHIVE_FAILED);
	}

	if (archive_entry_pathname_l(entry, &path, &len, get_sconv(a)) != 0
	    && errno == ENOMEM) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for Pathname");
		return (ARCHIVE_FATAL);
	}
	if (len == 0 || path == NULL || path[0] == '\0') {
		archive_set_error(&a->archive, -1, "Pathname required");
		return (ARCHIVE_FAILED);
	}

	if (!archive_entry_size_is_set(entry) || archive_entry_size(entry) < 0) {
		archive_set_error(&a->archive, -1, "Size required");
		return (ARCHIVE_FAILED);
	}
	return write_header(a, entry);
}